

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTestRunner.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_2a17f::TestRunnerFixtureSlowTestWithTimeExemptionPassesHelper::
~TestRunnerFixtureSlowTestWithTimeExemptionPassesHelper
          (TestRunnerFixtureSlowTestWithTimeExemptionPassesHelper *this)

{
  TestRunnerFixtureSlowTestWithTimeExemptionPassesHelper *this_local;
  
  TestRunnerFixture::~TestRunnerFixture(&this->super_TestRunnerFixture);
  return;
}

Assistant:

TEST_FIXTURE(TestRunnerFixture, SlowTestWithTimeExemptionPasses)
{
    class SlowExemptedTest : public Test
    {
    public:
        SlowExemptedTest() : Test("slowexempted", "", 0) {}
        virtual void RunImpl(TestResults&) const
        {
            UNITTEST_TIME_CONSTRAINT_EXEMPT();
            TimeHelpers::SleepMs(20);
        }
    };

    SlowExemptedTest test;
    list.Add(&test);

	runner.RunTestsIf(list, NULL, True(), 3);
    CHECK_EQUAL(0, reporter.testFailedCount);
}